

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(ReferenceQuadRenderer *this)

{
  ReferenceQuadRenderer *local_20;
  int local_14;
  int i;
  ReferenceQuadRenderer *this_local;
  
  local_20 = this;
  do {
    rr::Fragment::Fragment(local_20->m_fragmentBuffer);
    local_20 = (ReferenceQuadRenderer *)(local_20->m_fragmentBuffer + 1);
  } while (local_20 != (ReferenceQuadRenderer *)this->m_fragmentDepths);
  this->m_fragmentBufferSize = 0;
  rr::FragmentProcessor::FragmentProcessor(&this->m_fragmentProcessor);
  for (local_14 = 0; local_14 < 0x400; local_14 = local_14 + 1) {
    this->m_fragmentDepths[local_14] = 0.0;
  }
  return;
}

Assistant:

ReferenceQuadRenderer::ReferenceQuadRenderer (void)
	: m_fragmentBufferSize(0)
{
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_fragmentDepths); i++)
		m_fragmentDepths[i] = 0.0f;
}